

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleTests.cpp
# Opt level: O0

void __thiscall
ParticleTest_GetSetVelocity_Test<pica::Particle<(pica::Dimension)2>_>::TestBody
          (ParticleTest_GetSetVelocity_Test<pica::Particle<(pica::Dimension)2>_> *this)

{
  bool bVar1;
  AssertHelper *this_00;
  MomentumType *in_RDI;
  double dVar2;
  char *message;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  MomentumType v;
  MomentumType newVelocity;
  ParticleType particle;
  AssertHelper *in_stack_fffffffffffffed0;
  FP3 *in_stack_fffffffffffffed8;
  Particle<(pica::Dimension)2> *in_stack_fffffffffffffee0;
  int iVar3;
  Particle<(pica::Dimension)2> *in_stack_fffffffffffffef0;
  Type in_stack_fffffffffffffefc;
  AssertHelper *in_stack_ffffffffffffff00;
  BaseParticleFixture<pica::Particle<(pica::Dimension)2>_> *in_stack_ffffffffffffff10;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  double *in_stack_ffffffffffffff60;
  double *in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  Vector3<double> local_60 [4];
  
  BaseParticleFixture<pica::Particle<(pica::Dimension)2>_>::randomParticle
            (in_stack_ffffffffffffff10);
  pica::Vector3<double>::Vector3(local_60,5243.1654,-5623000.0,-0.0065237);
  pica::Particle<(pica::Dimension)2>::setVelocity(in_stack_fffffffffffffef0,in_RDI);
  in_RDI[1].x = 1e-12;
  pica::Particle<(pica::Dimension)2>::getVelocity(in_stack_fffffffffffffee0);
  dVar2 = pica::Vector3<double>::norm((Vector3<double> *)0x202037);
  if (dVar2 < in_RDI->z || dVar2 == in_RDI->z) {
    pica::Particle<(pica::Dimension)2>::getVelocity(in_stack_fffffffffffffee0);
    iVar3 = (int)((ulong)in_RDI >> 0x20);
    pica::dist((FP3 *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    testing::internal::CmpHelperLE<double,double>
              (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
               in_stack_ffffffffffffff60);
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xffffffffffffff20);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_ffffffffffffff00);
      this_00 = (AssertHelper *)
                testing::AssertionResult::failure_message((AssertionResult *)0x20225e);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,
                 (char *)in_stack_fffffffffffffef0,iVar3,(char *)in_stack_fffffffffffffee0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                 (Message *)in_stack_ffffffffffffff28.ptr_);
      testing::internal::AssertHelper::~AssertHelper(this_00);
      testing::Message::~Message((Message *)0x2022ac);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x202315);
  }
  else {
    pica::Particle<(pica::Dimension)2>::getVelocity(in_stack_fffffffffffffee0);
    iVar3 = (int)((ulong)in_RDI >> 0x20);
    message = (char *)pica::dist((FP3 *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    dVar2 = pica::Vector3<double>::norm((Vector3<double> *)0x202084);
    testing::internal::CmpHelperLE<double,double>
              (in_stack_ffffffffffffff78,(char *)((double)message / dVar2),in_stack_ffffffffffffff68
               ,in_stack_ffffffffffffff60);
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xffffffffffffff78);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_ffffffffffffff00);
      testing::AssertionResult::failure_message((AssertionResult *)0x2020fa);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,
                 (char *)in_stack_fffffffffffffef0,iVar3,message);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                 (Message *)in_stack_ffffffffffffff28.ptr_);
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffed0);
      testing::Message::~Message((Message *)0x20214e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2021bd);
  }
  return;
}

Assistant:

TYPED_TEST(ParticleTest, GetSetVelocity)
{
    typedef typename ParticleTest<TypeParam>::Particle ParticleType;
    typedef typename ParticleTest<TypeParam>::MomentumType MomentumType;

    ParticleType particle = this->randomParticle();
    MomentumType newVelocity(5243.1654, -56.23e5, -65.237e-4);
    particle.setVelocity(newVelocity);
    this->maxRelativeError = 1e-12;
    MomentumType v = particle.getVelocity();
    ASSERT_NEAR_VECTOR(newVelocity, particle.getVelocity());
}